

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

void __thiscall
supermap::Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::
dropRamIndexToDisk(Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this)

{
  long lVar1;
  SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>
  *pSVar2;
  void *pvVar3;
  int iVar4;
  undefined4 extraout_var;
  IndexStorageBase newBlock;
  vector<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_std::allocator<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>_>
  newBlockKeyIndex;
  _Any_data local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  undefined **local_b0;
  undefined **local_a8;
  long *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  void *local_78;
  undefined8 local_70;
  long local_68;
  string local_60;
  function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>>>()>
  local_40 [16];
  code *local_30;
  
  iVar4 = (*(((this->innerStorage_)._M_t.
              super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
              .
              super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
             ._M_head_impl)->
            super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[3])();
  if (CONCAT44(extraout_var,iVar4) != 0) {
    (*(((this->innerStorage_)._M_t.
        super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
        .
        super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_*,_false>
       ._M_head_impl)->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
      _vptr_KeyValueStorage[6])(&local_78);
    pvVar3 = local_78;
    Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::
    getNewBlockName_abi_cxx11_
              (&local_60,
               (Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long> *)this);
    lVar1 = (long)(((this->diskDataStorage_)._M_t.
                    super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
                    .
                    super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_*,_false>
                   ._M_head_impl)->sortedStorage_).
                  super_SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
                  .storageFile_.
                  super___shared_ptr<supermap::io::TemporaryFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_c8._8_8_ = *(undefined8 *)(lVar1 + 0x20);
    local_b8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar1 + 0x28);
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_b8->_M_use_count = local_b8->_M_use_count + 1;
      }
    }
    std::
    function<std::unique_ptr<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>,std::default_delete<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>>>>()>
    ::
    function<std::function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>,std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,supermap::Key<128ul>>>>()>&,void>
              (local_40,&this->registerSupplier_);
    SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>
    ::
    SortedSingleFileIndexedStorage<__gnu_cxx::__normal_iterator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>*,std::vector<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,std::allocator<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>>>>,supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&)_1_,supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::dropRamIndexToDisk()::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&)_2_>
              ((SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128ul>,unsigned_long>,unsigned_long,std::shared_ptr<supermap::Filter<supermap::Key<128ul>>>,supermap::Key<128ul>>
                *)&local_b0,pvVar3,local_70,1,&local_60,local_c8._M_pod_data + 8,local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(local_40,local_40,3);
    }
    if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((this->keyIndexStorageSupplier_).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    pSVar2 = (this->diskIndex_)._M_t.
             super___uniq_ptr_impl<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_*,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
             .
             super__Head_base<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_*,_false>
             ._M_head_impl;
    (*(this->keyIndexStorageSupplier_)._M_invoker)
              (&local_c8,
               (SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>
                *)&this->keyIndexStorageSupplier_);
    (**(pSVar2->
       super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
       )._vptr_OrderedStorage)
              (&pSVar2->
                super_OrderedStorage<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>,_unsigned_long,_void>
               ,&local_c8);
    if ((long *)local_c8._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_c8._M_unused._M_object + 0x18))();
    }
    local_b0 = &PTR_append_00207898;
    if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
    }
    local_b0 = &PTR___cxa_pure_virtual_00207910;
    local_a8 = &PTR_clone_00207940;
    if (local_98 != (long *)0x0) {
      (**(code **)(*local_98 + 0x10))();
    }
    if (local_78 != (void *)0x0) {
      operator_delete(local_78,local_68 - (long)local_78);
    }
  }
  return;
}

Assistant:

void dropRamIndexToDisk() {
        if (innerStorage_->getUpperSizeBound() == 0) {
            return;
        }
        std::vector<KeyIndex> newBlockKeyIndex = std::move(*innerStorage_).extract();
        auto newBlock = IndexStorageBase(
            newBlockKeyIndex.begin(),
            newBlockKeyIndex.end(),
            true,
            getNewBlockName(),
            diskDataStorage_->getFileManager(),
            [](const KeyIndex &a, const KeyIndex &b) { return a.key < b.key; },
            [](const KeyIndex &a, const KeyIndex &b) { return a.key == b.key; },
            registerSupplier_
        );
        diskIndex_->append(keyIndexStorageSupplier_(std::move(newBlock)));
    }